

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_exit(Context *context,IntrinsicResult partialResult)

{
  Value resultCode;
  undefined1 local_38 [32];
  
  exitASAP = true;
  MiniScript::String::String((String *)(local_38 + 0x10),"resultCode");
  MiniScript::Context::GetVar
            ((Context *)local_38,(String *)partialResult.rs,
             (LocalOnlyMode)(String *)(local_38 + 0x10));
  MiniScript::String::release((String *)(local_38 + 0x10));
  if (local_38[0] != Null) {
    exitResult = MiniScript::Value::IntValue((Value *)local_38);
  }
  MiniScript::Machine::Stop((Machine *)partialResult.rs[2].result.data.ref);
  MiniScript::IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  MiniScript::Value::~Value((Value *)local_38);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exit(Context *context, IntrinsicResult partialResult) {
	exitASAP = true;
	Value resultCode = context->GetVar("resultCode");
	if (!resultCode.IsNull()) exitResult = (int)resultCode.IntValue();
	context->vm->Stop();
	return IntrinsicResult::Null;
}